

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTSEQEncStart(der_anchor_t *anchor,octet *der,size_t pos,u32 tag)

{
  bool_t bVar1;
  size_t sVar2;
  u32 in_ECX;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  octet *in_stack_fffffffffffffff8;
  
  bVar1 = derTIsValid(in_ECX);
  if ((bVar1 != 0) && (bVar1 = derTIsConstructive(0), bVar1 != 0)) {
    *in_RDI = in_RSI;
    in_RDI[1] = in_RDX;
    *(u32 *)(in_RDI + 2) = in_ECX;
    in_RDI[3] = 0;
    sVar2 = derEnc(in_stack_fffffffffffffff8,(u32)((ulong)in_RDI >> 0x20),in_RSI,in_RDX);
    return sVar2;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t derTSEQEncStart(der_anchor_t* anchor, octet der[], size_t pos, u32 tag)
{
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	// проверить тег
	if (!derTIsValid(tag) || !derTIsConstructive(tag))
		return SIZE_MAX;
	// бросить якорь
	anchor->der = der;
	anchor->pos = pos;
	anchor->tag = tag;
	anchor->len = 0;
	// кодировать пустую (пока) структуру
	return derEnc(der, tag, 0, 0);
}